

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::
SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>::
emplaceRealloc<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
          (SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
           *this,pointer pos,
          pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> *args)

{
  ulong uVar1;
  unsigned_long uVar2;
  pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> *__cur_1;
  unsigned_long *puVar3;
  pointer ppVar4;
  unsigned_long *puVar5;
  pointer ppVar6;
  ValueDriver *pVVar7;
  ValueDriver *ctx;
  long lVar8;
  
  if (*(long *)(this + 8) == 0x555555555555555) {
    detail::throwLengthError();
  }
  pVVar7 = (ValueDriver *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (ValueDriver *)(uVar1 * 2);
  if (pVVar7 < ctx) {
    pVVar7 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    pVVar7 = (ValueDriver *)0x555555555555555;
  }
  lVar8 = (long)pos - *(long *)this;
  puVar3 = (unsigned_long *)operator_new((long)pVVar7 * 0x18);
  *(ValueDriver **)((long)puVar3 + lVar8 + 0x10) = args->second;
  uVar2 = (args->first).second;
  *(unsigned_long *)((long)puVar3 + lVar8) = (args->first).first;
  ((unsigned_long *)((long)puVar3 + lVar8))[1] = uVar2;
  ppVar6 = *(pointer *)this;
  ppVar4 = ppVar6 + *(long *)(this + 8);
  puVar5 = puVar3;
  if (ppVar4 == pos) {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      puVar5[2] = (unsigned_long)ppVar6->second;
      uVar2 = (ppVar6->first).second;
      *puVar5 = (ppVar6->first).first;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 3;
    }
  }
  else {
    for (; ppVar6 != pos; ppVar6 = ppVar6 + 1) {
      ctx = ppVar6->second;
      puVar5[2] = (unsigned_long)ctx;
      uVar2 = (ppVar6->first).second;
      *puVar5 = (ppVar6->first).first;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 3;
    }
    puVar5 = (unsigned_long *)(lVar8 + (long)puVar3);
    for (; pos != ppVar4; pos = pos + 1) {
      puVar5[5] = (unsigned_long)pos->second;
      uVar2 = (pos->first).second;
      puVar5[3] = (pos->first).first;
      puVar5[4] = uVar2;
      puVar5 = puVar5 + 3;
    }
  }
  SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
  ::cleanup((SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
             *)this,(EVP_PKEY_CTX *)ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ValueDriver **)(this + 0x10) = pVVar7;
  *(unsigned_long **)this = puVar3;
  return (pointer)((long)puVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}